

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O0

void __thiscall
capnp::compiler::Lexer::Lexer(Lexer *this,Orphanage orphanageParam,ErrorReporter *errorReporter)

{
  ExactlyConst_<char,__(_> *pEVar1;
  Transform_<kj::parse::Sequence_<kj::parse::Many_<const_kj::parse::CharGroup__&,_true>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_kj::parse::Optional_<kj::parse::CharGroup_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>,_kj::parse::_::ParseFloat>
  *functor;
  Sequence_<_252d88ae_> *other;
  OneOf_<_176662c1_> *pOVar2;
  parse *ppVar3;
  Sequence_<_eca1256e_> *other_00;
  Parser<kj::Array<Orphan<Token>_>_> *this_00;
  ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>
  *subParsers_1;
  Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>
  *subParsers_1_00;
  ExactlyConst_<char,___xfe_> *subParsers_1_01;
  Parser<kj::Array<Orphan<Statement>_>_> *subParsers_1_02;
  Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>
  *subParser;
  Many_<kj::parse::CharGroup_,_true> *subParser_00;
  ExactlyConst_<char,___xff_> *subParsers;
  ExactlyConst_<char,___xfe_> *subParsers_00;
  ExactlyConst_<char,___x00_> *subParsers_01;
  Sequence_<_fd5f6d6d_> *subParser_01;
  Sequence_<kj::parse::ExactlyConst_<char,___x00_>_> *in_R8;
  TransformWithLocation_<const_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Many_<const_kj::parse::CharGroup__&,_true>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_kj::parse::Optional_<kj::parse::CharGroup_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>,_kj::parse::_::ParseFloat>_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:202:11)>
  TVar4;
  TransformWithLocation_<kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_true>,_kj::parse::_::ArrayToString>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:209:11)>
  *parsers_5;
  Sequence_<_fd5f6d6d_> local_610;
  undefined1 local_5f8 [71];
  Sequence_<_44043393_> local_5b1;
  TransformWithLocation_<_9a831fc1_> local_598;
  parse *local_578;
  TransformWithLocation_<_9a831fc1_> *statement;
  undefined1 local_563 [3];
  Sequence_<_2f3d041a_> local_560;
  Transform_<_972e7e89_> local_530;
  Lexer *local_4f8;
  parse local_4e9;
  Sequence_<kj::parse::ExactlyConst_<char,____>,_const_kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>_&>
  local_4e8;
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_const_kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>_&>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:246:11)>
  local_4d0;
  OneOf_<_176662c1_> local_4b0;
  OneOf_<_176662c1_> *local_450;
  OneOf_<_176662c1_> *statementEnd;
  Parser<kj::Array<Orphan<Statement>_>_> *statementSequence;
  Many_<_364f5054_> local_428;
  Sequence_<_252d88ae_> local_410;
  undefined1 local_3e1;
  OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___x00_>_>_>
  local_3e0 [2];
  undefined4 local_3c8;
  parse local_3c1 [2];
  undefined1 local_3bf [8];
  parse local_3b7 [2];
  undefined1 local_3b5 [4];
  parse local_3b1 [9];
  TransformWithLocation_<kj::parse::OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___x00_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:234:11)>
  local_3a8;
  TransformOrReject_<kj::parse::TransformWithLocation_<kj::parse::OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___x00_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:234:11)>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:238:15)>
  local_390;
  Lexer *local_370;
  ExactlyConst_<char,___xfe_> local_363 [2];
  parse local_361;
  Sequence_<kj::parse::ExactlyConst_<char,__[_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>_&,_kj::parse::ExactlyConst_<char,__]_>_>
  local_360;
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:224:11)>
  local_348;
  Lexer *local_328;
  undefined1 local_31b [3];
  Sequence_<kj::parse::ExactlyConst_<char,__(_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>_&,_kj::parse::ExactlyConst_<char,__)_>_>
  local_318;
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__(_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>_&,_kj::parse::ExactlyConst_<char,__)_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:216:11)>
  local_300;
  Transform_<kj::parse::Many_<kj::parse::CharGroup_,_true>,_kj::parse::_::ArrayToString> local_2e0;
  Many_<kj::parse::CharGroup_,_true> local_2b8;
  Transform_<kj::parse::Many_<kj::parse::CharGroup_,_true>,_kj::parse::_::ArrayToString> local_298;
  TransformWithLocation_<kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_true>,_kj::parse::_::ArrayToString>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:209:11)>
  local_270;
  Type local_240;
  TransformWithLocation_<const_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Many_<const_kj::parse::CharGroup__&,_true>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_kj::parse::Optional_<kj::parse::CharGroup_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>,_kj::parse::_::ParseFloat>_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:202:11)>
  local_238;
  Type local_228;
  TransformWithLocation_<const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:196:11)>
  local_220;
  Type local_210;
  TransformWithLocation_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>,_true>,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ExactlyConst_<char,____>_>_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:190:11)>
  local_208;
  Type local_1f8;
  TransformWithLocation_<const_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,____>_>,_kj::parse::_::ArrayToString>_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:184:11)>
  local_1f0;
  Type local_1e0;
  TransformWithLocation_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:178:11)>
  local_1d8;
  OneOf_<_2cbc8147_> local_1c8;
  OneOf_<_2cbc8147_> *local_e0;
  OneOf_<_2cbc8147_> *token;
  Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>
  local_d0;
  Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>
  local_b8;
  Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>
  local_a0;
  Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>
  local_78;
  ExactlyConst_<char,__(_> *local_48;
  Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>
  *commaDelimitedList;
  Parser<kj::Array<Orphan<Token>_>_> *tokenSequence;
  ErrorReporter *local_28;
  ErrorReporter *errorReporter_local;
  Lexer *this_local;
  Orphanage orphanageParam_local;
  
  orphanageParam_local.arena = (BuilderArena *)orphanageParam.capTable;
  this_local = (Lexer *)orphanageParam.arena;
  (this->orphanage).arena = (BuilderArena *)this_local;
  (this->orphanage).capTable = (CapTableBuilder *)orphanageParam_local.arena;
  local_28 = errorReporter;
  errorReporter_local = (ErrorReporter *)this;
  kj::Arena::Arena(&this->arena,0x400);
  Parsers::Parsers(&this->parsers);
  this_00 = &(this->parsers).tokenSequence;
  subParsers_1 = this_00;
  commaDelimitedList =
       (Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>
        *)this_00;
  kj::parse::exactChar<(char)44>();
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>
            (&local_d0,(parse *)((long)&token + 7),(ExactlyConst_<char,__,_> *)commaDelimitedList,
             subParsers_1);
  kj::parse::
  many<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>>
            (&local_b8,(parse *)&local_d0,subParser);
  kj::parse::
  sequence<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>
            (&local_a0,(parse *)this_00,
             (ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>
              *)&local_b8,
             (Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>
              *)subParsers_1);
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>
            (&local_78,(parse *)&local_a0,
             (Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>
              *)((long)&token + 5),(Type *)subParsers_1);
  local_48 = (ExactlyConst_<char,__(_> *)
             kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>>
                       (&this->arena,&local_78);
  local_1e0.this = this;
  local_1d8 = kj::parse::
              transformWithLocation<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::IdentifierToString>const&,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__1>
                        ((Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>
                          *)kj::parse::identifier,&local_1e0);
  local_1f8.this = this;
  local_1f0 = kj::parse::
              transformWithLocation<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)34>,kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)92>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,kj::parse::_::InterpretEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)120>,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Optional_<kj::parse::CharGroup_const&>,kj::parse::Optional_<kj::parse::CharGroup_const&>>,kj::parse::_::ParseOctEscape>>>const&>,false>,kj::parse::ExactlyConst_<char,(char)34>>,kj::parse::_::ArrayToString>const&,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__2>
                        ((Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,____>_>,_kj::parse::_::ArrayToString>
                          *)kj::parse::doubleQuotedString,&local_1f8);
  local_210.this = this;
  local_208 = kj::parse::
              transformWithLocation<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::ExactlyConst_<char,(char)34>,kj::parse::Many_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexByte>,true>,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ExactlyConst_<char,(char)34>>const&,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__3>
                        ((Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>,_true>,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ExactlyConst_<char,____>_>
                          *)kj::parse::doubleQuotedHexBinary,&local_210);
  local_228.this = this;
  local_220 = kj::parse::
              transformWithLocation<kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::Many_<kj::parse::CharGroup_const&,true>>,kj::parse::_::ParseInteger<16u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<8u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<10u>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>const&,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__4>
                        ((Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>
                          *)kj::parse::integer,&local_228);
  local_240.this = this;
  TVar4 = kj::parse::
          transformWithLocation<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Many_<kj::parse::CharGroup_const&,true>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)46>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,kj::parse::Optional_<kj::parse::CharGroup_>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>,kj::parse::_::ParseFloat>const&,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__5>
                    ((Transform_<kj::parse::Sequence_<kj::parse::Many_<const_kj::parse::CharGroup__&,_true>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_kj::parse::Optional_<kj::parse::CharGroup_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>,_kj::parse::_::ParseFloat>
                      *)kj::parse::number,&local_240);
  local_238.transform = TVar4.transform.this;
  functor = TVar4.subParser;
  local_238.subParser = functor;
  kj::parse::anyOfChars((CharGroup_ *)(local_2e0.subParser.subParser.bits + 1),"!$%&*+-./:<=>?@^|~")
  ;
  kj::parse::oneOrMore<kj::parse::CharGroup_>
            (&local_2b8,(CharGroup_ *)(local_2e0.subParser.subParser.bits + 1));
  kj::parse::charsToString<kj::parse::Many_<kj::parse::CharGroup_,true>>
            (&local_298,(parse *)&local_2b8,subParser_00);
  local_2e0.subParser.subParser.bits[0] = (Bits64)this;
  kj::parse::
  transformWithLocation<kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,true>,kj::parse::_::ArrayToString>,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__6>
            (&local_270,(parse *)&local_298,&local_2e0,(Type *)functor);
  kj::parse::exactChar<(char)40>();
  pEVar1 = local_48;
  kj::parse::exactChar<(char)41>();
  subParsers_1_00 =
       (Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>
        *)local_31b;
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)40>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>&,kj::parse::ExactlyConst_<char,(char)41>>
            (&local_318,(parse *)(local_31b + 2),pEVar1,subParsers_1_00,
             (ExactlyConst_<char,__)_> *)in_R8);
  local_328 = this;
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)40>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>,capnp::compiler::Lexer::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>&,kj::parse::ExactlyConst_<char,(char)41>>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__7>
            (&local_300,(parse *)&local_318,
             (Sequence_<kj::parse::ExactlyConst_<char,__(_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>_&,_kj::parse::ExactlyConst_<char,__)_>_>
              *)&local_328,(Type *)subParsers_1_00);
  kj::parse::exactChar<(char)91>();
  pEVar1 = local_48;
  kj::parse::exactChar<(char)93>();
  subParsers_1_01 = local_363;
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>&,kj::parse::ExactlyConst_<char,(char)93>>
            (&local_360,&local_361,(ExactlyConst_<char,__[_> *)pEVar1,
             (Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>
              *)subParsers_1_01,(ExactlyConst_<char,__]_> *)in_R8);
  local_370 = this;
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>,capnp::compiler::Lexer::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>&,kj::parse::ExactlyConst_<char,(char)93>>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__8>
            (&local_348,(parse *)&local_360,
             (Sequence_<kj::parse::ExactlyConst_<char,__[_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>_&,_kj::parse::ExactlyConst_<char,__]_>_>
              *)&local_370,(Type *)subParsers_1_01);
  kj::parse::exactChar<(char)_1>();
  kj::parse::exactChar<(char)_2>();
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)_1>,kj::parse::ExactlyConst_<char,(char)_2>>
            ((Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>
              *)local_3b5,local_3b7,subParsers,subParsers_1_01);
  kj::parse::exactChar<(char)_2>();
  kj::parse::exactChar<(char)_1>();
  ppVar3 = local_3c1;
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)_2>,kj::parse::ExactlyConst_<char,(char)_1>>
            ((Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>
              *)local_3bf,ppVar3,subParsers_00,(ExactlyConst_<char,___xff_> *)subParsers_1_01);
  kj::parse::exactChar<(char)0>();
  kj::parse::sequence<kj::parse::ExactlyConst_<char,(char)0>>
            ((Sequence_<kj::parse::ExactlyConst_<char,___x00_>_> *)&local_3c8,ppVar3,subParsers_01);
  kj::parse::
  oneOf<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_1>,kj::parse::ExactlyConst_<char,(char)_2>>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_2>,kj::parse::ExactlyConst_<char,(char)_1>>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)0>>>
            ((OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___x00_>_>_>
              *)(local_3b5 + 1),(parse *)(local_3bf + 1),
             (Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>
              *)((long)&local_3c8 + 1),
             (Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>
              *)subParsers_1_01,in_R8);
  local_3e0[0]._0_8_ = local_28;
  kj::parse::
  transformWithLocation<kj::parse::OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_1>,kj::parse::ExactlyConst_<char,(char)_2>>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_2>,kj::parse::ExactlyConst_<char,(char)_1>>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)0>>>,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__9>
            (&local_3a8,local_3b1,local_3e0,(Type *)subParsers_1_01);
  kj::parse::
  transformOrReject<kj::parse::TransformWithLocation_<kj::parse::OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_1>,kj::parse::ExactlyConst_<char,(char)_2>>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_2>,kj::parse::ExactlyConst_<char,(char)_1>>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)0>>>,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__9>,capnp::compiler::Lexer::TransformWithLocation_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__10>
            (&local_390,(parse *)&local_3a8,
             (TransformWithLocation_<kj::parse::OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___x00_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:234:11)>
              *)&local_3e1,(Type *)subParsers_1_01);
  parsers_5 = &local_270;
  kj::parse::oneOf<_2cbc8147_>
            (&local_1c8,&local_1d8,&local_1f0,&local_208,&local_220,&local_238,parsers_5,&local_300,
             &local_348,&local_390);
  local_e0 = kj::Arena::copy<_a58e5a6f_>(&this->arena,&local_1c8);
  kj::parse::sequence<_5436fc9_>
            ((Sequence_<_5436fc9_> *)&statementSequence,local_e0,
             (Sequence_<const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>,_false>,_kj::_::Tuple<>_>_>
              *)(anonymous_namespace)::commentsAndWhitespace);
  kj::parse::many<_db163405_>(&local_428,(Sequence_<_5436fc9_> *)&statementSequence);
  kj::parse::sequence<_252d88ae_>
            (&local_410,
             (Sequence_<const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>,_false>,_kj::_::Tuple<>_>_>
              *)(anonymous_namespace)::commentsAndWhitespace,&local_428);
  other = kj::Arena::copy<_5dc27cb6_>(&this->arena,&local_410);
  kj::parse::
  ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>
  ::operator=<_5a8d1a30_>(&(this->parsers).tokenSequence,other);
  subParsers_1_02 = &(this->parsers).statementSequence;
  statementEnd = (OneOf_<_176662c1_> *)subParsers_1_02;
  kj::parse::exactChar<(char)59>();
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,kj::_::Tuple<>>,kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,false>,kj::parse::_::ArrayToString>,kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::EndOfInput_const&>>const&>,true>>>const&>
            (&local_4e8,&local_4e9,(ExactlyConst_<char,____> *)(anonymous_namespace)::docComment,
             (Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>
              *)subParsers_1_02);
  local_4f8 = this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,kj::_::Tuple<>>,kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,false>,kj::parse::_::ArrayToString>,kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::EndOfInput_const&>>const&>,true>>>const&>,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__11>
            (&local_4d0,(parse *)&local_4e8,
             (Sequence_<kj::parse::ExactlyConst_<char,____>,_const_kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>_&>
              *)&local_4f8,(Type *)subParsers_1_02);
  kj::parse::exactChar<(char)123>();
  pOVar2 = statementEnd;
  kj::parse::exactChar<(char)125>();
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)123>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,kj::_::Tuple<>>,kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,false>,kj::parse::_::ArrayToString>,kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)1___:OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::EndOfInput_const&>>const&>,true>>>const&>
            (&local_560,(parse *)(local_563 + 2),
             (ExactlyConst_<char,____> *)(anonymous_namespace)::docComment,
             (Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>
              *)pOVar2,
             (ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_>
              *)local_563,(ExactlyConst_<char,____> *)(anonymous_namespace)::docComment,
             (Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>
              *)parsers_5);
  statement = (TransformWithLocation_<_9a831fc1_> *)this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)123>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,kj::_::Tuple<>>,kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,false>,kj::parse::_::ArrayToString>,kj::parse::OneOf_<kj::parse::Exac___>>const&>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__12>
            (&local_530,(parse *)&local_560,(Sequence_<_2f3d041a_> *)&statement,(Type *)pOVar2);
  kj::parse::
  oneOf<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,kj::_::Tuple<>>,kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,false>,kj::parse::_::ArrayToString>,kj::parse::OneOf___const&>,capnp::compiler::Lexer::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__12>>
            (&local_4b0,(parse *)&local_4d0,
             (Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_const_kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>_&>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_lexer_c__:246:11)>
              *)&local_530,(Transform_<_972e7e89_> *)pOVar2);
  pOVar2 = kj::Arena::
           copy<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,kj::_::Tuple<>>,kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,false>,kj::parse::_::ArrayToString>___onst&>,capnp::compiler::Lexer::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__12>>>
                     (&this->arena,&local_4b0);
  local_450 = pOVar2;
  kj::parse::
  sequence<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,___nst&>,capnp::compiler::Lexer::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__12>>&>
            ((Sequence_<_44043393_> *)((long)&local_5b1.first + 1),(parse *)commaDelimitedList,
             (ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>
              *)pOVar2,pOVar2);
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::par___:__12>>&>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__13>
            (&local_598,(parse *)((long)&local_5b1.first + 1),&local_5b1,(Type *)pOVar2);
  ppVar3 = (parse *)kj::Arena::
                    copy<kj::parse::TransformWithLocation_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::_____12>>&>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__13>>
                              (&this->arena,&local_598);
  local_578 = ppVar3;
  kj::parse::
  sequence<kj::parse::TransformWithLocation_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::par___Tuple<>>,false>,kj::_::Tuple<>>const&>,false>,kj::_::Tuple<>>>const&>,false>,kj::_::Tuple<>>>const&>
            (&local_610,ppVar3,
             (TransformWithLocation_<_9a831fc1_> *)(anonymous_namespace)::commentsAndWhitespace,
             (Sequence_<const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>,_false>,_kj::_::Tuple<>_>_>
              *)ppVar3);
  kj::parse::
  many<kj::parse::Sequence_<kj::parse::TransformWithLocation_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::Con___uple<>>,false>,kj::_::Tuple<>>const&>,false>,kj::_::Tuple<>>>const&>,false>,kj::_::Tuple<>>>const&>>
            ((Many_<_48f20984_> *)local_5f8,(parse *)&local_610,subParser_01);
  kj::parse::
  sequence<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_17>,kj::parse::ExactlyConst_<char,(char)_69>,kj::parse::ExactlyConst_<char,(char)_65>>const&,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&>,false>,kj::_::Tuple<>>>const&,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>,kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::EndOfInput_const&>>const&,kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::___,false>,kj::_::Tuple<>>const&>,false>,kj::_::Tuple<>>>const&>,false>,kj::_::Tuple<>>>const_>_false>>
            ((Sequence_<_eca1256e_> *)(local_5f8 + 0x18),
             (parse *)(anonymous_namespace)::commentsAndWhitespace,
             (Sequence_<const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>,_false>,_kj::_::Tuple<>_>_>
              *)local_5f8,(Many_<_48f20984_> *)ppVar3);
  other_00 = kj::Arena::
             copy<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_17>,kj::parse::ExactlyConst_<char,(char)_69>,kj::parse::ExactlyConst_<char,(char)_65>>const&,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&>,false>,kj::_::Tuple<>>>const&,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>,kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::EndOfInput_const&>>const&,kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstRe___false>,kj::_::Tuple<>>const&>,false>,kj::_::Tuple<>>>const&>,false>,kj::_::Tuple<>>>const_>_false>>>
                       (&this->arena,(Sequence_<_eca1256e_> *)(local_5f8 + 0x18));
  kj::parse::
  ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Statement>>>
  ::operator=((ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Statement>>>
               *)&(this->parsers).statementSequence,other_00);
  kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_capnp::Orphan<capnp::compiler::Token>_>
  ::operator=<_c3cf397_>(&(this->parsers).token,local_e0);
  kj::parse::
  ParserRef<capnp::compiler::Lexer::ParserInput,capnp::Orphan<capnp::compiler::Statement>>::
  operator=((ParserRef<capnp::compiler::Lexer::ParserInput,capnp::Orphan<capnp::compiler::Statement>>
             *)&(this->parsers).statement,(TransformWithLocation_<_9a831fc1_> *)local_578);
  kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::_::Tuple<>>::operator=
            ((ParserRef<capnp::compiler::Lexer::ParserInput,kj::_::Tuple<>> *)&this->parsers,
             (Sequence_<const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>,_false>,_kj::_::Tuple<>_>_>
              *)(anonymous_namespace)::commentsAndWhitespace);
  return;
}

Assistant:

Lexer::Lexer(Orphanage orphanageParam, ErrorReporter& errorReporter)
    : orphanage(orphanageParam) {

  // Note that because passing an lvalue to a parser constructor uses it by-referencee, it's safe
  // for us to use parsers.tokenSequence even though we haven't yet constructed it.
  auto& tokenSequence = parsers.tokenSequence;

  auto& commaDelimitedList = arena.copy(p::transform(
      p::sequence(tokenSequence, p::many(p::sequence(p::exactChar<','>(), tokenSequence))),
      [](kj::Array<Orphan<Token>>&& first, kj::Array<kj::Array<Orphan<Token>>>&& rest)
          -> kj::Array<kj::Array<Orphan<Token>>> {
        if (first == nullptr && rest == nullptr) {
          // Completely empty list.
          return nullptr;
        } else {
          uint restSize = rest.size();
          if (restSize > 0 && rest[restSize - 1] == nullptr) {
            // Allow for trailing commas by shortening the list by one item if the final token is
            // nullptr
            restSize--;
          }
          auto result = kj::heapArrayBuilder<kj::Array<Orphan<Token>>>(1 + restSize); // first+rest
          result.add(kj::mv(first));
          for (uint i = 0; i < restSize ; i++) {
            result.add(kj::mv(rest[i]));
          }
          return result.finish();
        }
      }));

  auto& token = arena.copy(p::oneOf(
      p::transformWithLocation(p::identifier,
          [this](Location loc, kj::String name) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setIdentifier(name);
            return t;
          }),
      p::transformWithLocation(p::doubleQuotedString,
          [this](Location loc, kj::String text) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setStringLiteral(text);
            return t;
          }),
      p::transformWithLocation(p::doubleQuotedHexBinary,
          [this](Location loc, kj::Array<byte> data) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setBinaryLiteral(data);
            return t;
          }),
      p::transformWithLocation(p::integer,
          [this](Location loc, uint64_t i) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setIntegerLiteral(i);
            return t;
          }),
      p::transformWithLocation(p::number,
          [this](Location loc, double x) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setFloatLiteral(x);
            return t;
          }),
      p::transformWithLocation(
          p::charsToString(p::oneOrMore(p::anyOfChars("!$%&*+-./:<=>?@^|~"))),
          [this](Location loc, kj::String text) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setOperator(text);
            return t;
          }),
      p::transformWithLocation(
          sequence(p::exactChar<'('>(), commaDelimitedList, p::exactChar<')'>()),
          [this](Location loc, kj::Array<kj::Array<Orphan<Token>>>&& items) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            buildTokenSequenceList(
                initTok(t, loc).initParenthesizedList(items.size()), kj::mv(items));
            return t;
          }),
      p::transformWithLocation(
          sequence(p::exactChar<'['>(), commaDelimitedList, p::exactChar<']'>()),
          [this](Location loc, kj::Array<kj::Array<Orphan<Token>>>&& items) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            buildTokenSequenceList(
                initTok(t, loc).initBracketedList(items.size()), kj::mv(items));
            return t;
          }),
      p::transformOrReject(p::transformWithLocation(
          p::oneOf(sequence(p::exactChar<'\xff'>(), p::exactChar<'\xfe'>()),
                   sequence(p::exactChar<'\xfe'>(), p::exactChar<'\xff'>()),
                   sequence(p::exactChar<'\x00'>())),
          [&errorReporter](Location loc) -> kj::Maybe<Orphan<Token>> {
            errorReporter.addError(loc.begin(), loc.end(),
                "Non-UTF-8 input detected. Cap'n Proto schema files must be UTF-8 text.");
            return nullptr;
          }), [](kj::Maybe<Orphan<Token>> param) { return param; })));
  parsers.tokenSequence = arena.copy(p::sequence(
      commentsAndWhitespace, p::many(p::sequence(token, commentsAndWhitespace))));

  auto& statementSequence = parsers.statementSequence;

  auto& statementEnd = arena.copy(p::oneOf(
      transform(p::sequence(p::exactChar<';'>(), docComment),
          [this](kj::Maybe<kj::Array<kj::String>>&& comment) -> Orphan<Statement> {
            auto result = orphanage.newOrphan<Statement>();
            auto builder = result.get();
            KJ_IF_MAYBE(c, comment) {
              attachDocComment(builder, kj::mv(*c));
            }
            builder.setLine();
            return result;
          }),
      transform(
          p::sequence(p::exactChar<'{'>(), docComment, statementSequence, p::exactChar<'}'>(),
                      docComment),
          [this](kj::Maybe<kj::Array<kj::String>>&& comment,
                 kj::Array<Orphan<Statement>>&& statements,
                 kj::Maybe<kj::Array<kj::String>>&& lateComment)
              -> Orphan<Statement> {
            auto result = orphanage.newOrphan<Statement>();
            auto builder = result.get();
            KJ_IF_MAYBE(c, comment) {
              attachDocComment(builder, kj::mv(*c));
            } else KJ_IF_MAYBE(c, lateComment) {
              attachDocComment(builder, kj::mv(*c));
            }
            auto list = builder.initBlock(statements.size());
            for (uint i = 0; i < statements.size(); i++) {
              list.adoptWithCaveats(i, kj::mv(statements[i]));
            }
            return result;
          })
      ));

  auto& statement = arena.copy(p::transformWithLocation(p::sequence(tokenSequence, statementEnd),
      [](Location loc, kj::Array<Orphan<Token>>&& tokens, Orphan<Statement>&& statement) {
        auto builder = statement.get();
        auto tokensBuilder = builder.initTokens(tokens.size());
        for (uint i = 0; i < tokens.size(); i++) {
          tokensBuilder.adoptWithCaveats(i, kj::mv(tokens[i]));
        }
        builder.setStartByte(loc.begin());
        builder.setEndByte(loc.end());
        return kj::mv(statement);
      }));

  parsers.statementSequence = arena.copy(sequence(
      commentsAndWhitespace, many(sequence(statement, commentsAndWhitespace))));

  parsers.token = token;
  parsers.statement = statement;
  parsers.emptySpace = commentsAndWhitespace;
}